

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::TabItemButton(char *label,ImGuiTabItemFlags flags)

{
  ImGuiTabBar *tab_bar;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImGuiTabItemFlags in_stack_000001a4;
  bool *in_stack_000001a8;
  char *in_stack_000001b0;
  ImGuiTabBar *in_stack_000001b8;
  bool local_1;
  
  if ((GImGui->CurrentWindow->SkipItems & 1U) == 0) {
    if (GImGui->CurrentTabBar == (ImGuiTabBar *)0x0) {
      local_1 = false;
    }
    else {
      local_1 = TabItemEx(in_stack_000001b8,in_stack_000001b0,in_stack_000001a8,in_stack_000001a4);
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool    ImGui::TabItemButton(const char* label, ImGuiTabItemFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->SkipItems)
        return false;

    ImGuiTabBar* tab_bar = g.CurrentTabBar;
    if (tab_bar == NULL)
    {
        IM_ASSERT_USER_ERROR(tab_bar != NULL, "Needs to be called between BeginTabBar() and EndTabBar()!");
        return false;
    }
    return TabItemEx(tab_bar, label, NULL, flags | ImGuiTabItemFlags_Button | ImGuiTabItemFlags_NoReorder);
}